

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

char * duckdb::NumericHelper::FormatUnsigned<unsigned_long>(unsigned_long value,char *ptr)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  unsigned_long uVar5;
  
  uVar5 = value;
  if (99 < value) {
    do {
      uVar5 = value / 100;
      uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert((value % 100) * 2);
      ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar3 + 1];
      ptr[-2] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar3];
      ptr = ptr + -2;
      bVar1 = 9999 < value;
      value = uVar5;
    } while (bVar1);
  }
  if (uVar5 < 10) {
    cVar2 = NumericCastImpl<char,_unsigned_long,_false>::Convert(uVar5 | 0x30);
    lVar4 = -1;
  }
  else {
    uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar5 * 2);
    ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar3 + 1];
    cVar2 = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar3];
    lVar4 = -2;
  }
  ptr[lVar4] = cVar2;
  return ptr + lVar4;
}

Assistant:

static char *FormatUnsigned(T value, char *ptr) {
		while (value >= 100) {
			// Integer division is slow so do it for a group of two digits instead
			// of for every digit. The idea comes from the talk by Alexandrescu
			// "Three Optimization Tips for C++".
			auto index = NumericCast<unsigned>((value % 100) * 2);
			value /= 100;
			*--ptr = duckdb_fmt::internal::data::digits[index + 1];
			*--ptr = duckdb_fmt::internal::data::digits[index];
		}
		if (value < 10) {
			*--ptr = NumericCast<char>('0' + value);
			return ptr;
		}
		auto index = NumericCast<unsigned>(value * 2);
		*--ptr = duckdb_fmt::internal::data::digits[index + 1];
		*--ptr = duckdb_fmt::internal::data::digits[index];
		return ptr;
	}